

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astMakeAssociationNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  anon_struct_24_3_54f70302 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 3;
  local_30 = (undefined1 *)&local_78;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  local_78 = sysbvm_interpreter_evaluateASTWithEnvironment
                       (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  if (*(sysbvm_tuple_t *)(*arguments + 0x30) != 0) {
    sStack_70 = sysbvm_interpreter_evaluateASTWithEnvironment
                          (context,*(sysbvm_tuple_t *)(*arguments + 0x30),arguments[1]);
  }
  local_68 = sysbvm_association_create(context,local_78,sStack_70);
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_68;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeAssociationNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMakeAssociationNode_t **associationNode = (sysbvm_astMakeAssociationNode_t**)node;

    struct {
        sysbvm_tuple_t key;
        sysbvm_tuple_t value;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*associationNode)->super.sourcePosition);

    gcFrame.key = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*associationNode)->key, *environment);
    if((*associationNode)->value)
        gcFrame.value = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*associationNode)->value, *environment);
    gcFrame.result = sysbvm_association_create(context, gcFrame.key, gcFrame.value);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}